

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_3_4::ThreadPool::Data::setProvider(Data *this,ProviderPtr *provider)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> *in_RSI;
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> *in_RDI;
  ProviderPtr curp;
  __shared_ptr local_20 [16];
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> *__r;
  shared_ptr<IlmThread_3_4::ThreadPoolProvider> *__p;
  
  __r = in_RSI;
  __p = in_RDI;
  std::shared_ptr<IlmThread_3_4::ThreadPoolProvider>::shared_ptr(in_RDI,in_RSI);
  std::atomic_exchange<IlmThread_3_4::ThreadPoolProvider>(__p,__r);
  std::shared_ptr<IlmThread_3_4::ThreadPoolProvider>::~shared_ptr
            ((shared_ptr<IlmThread_3_4::ThreadPoolProvider> *)0x10a5ab);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if ((bVar1) && (bVar1 = std::operator!=(in_RDI,in_RSI), bVar1)) {
    peVar2 = std::
             __shared_ptr_access<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<IlmThread_3_4::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10a5d9);
    (*peVar2->_vptr_ThreadPoolProvider[5])();
  }
  std::shared_ptr<IlmThread_3_4::ThreadPoolProvider>::~shared_ptr
            ((shared_ptr<IlmThread_3_4::ThreadPoolProvider> *)0x10a627);
  return;
}

Assistant:

void setProvider (ProviderPtr provider)
    {
        ProviderPtr curp = std::atomic_exchange (&_provider, provider);
        if (curp && curp != provider) curp->finish ();
    }